

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general.c
# Opt level: O0

axbStatus_t axbMemBackendGetByName(axbHandle_s *handle,axbMemBackend_s **mem,char *name)

{
  int iVar1;
  ulong local_30;
  size_t i;
  char *name_local;
  axbMemBackend_s **mem_local;
  axbHandle_s *handle_local;
  
  *mem = (axbMemBackend_s *)0x0;
  local_30 = 0;
  while( true ) {
    if (handle->memBackends_size <= local_30) {
      return 0;
    }
    iVar1 = strcmp(handle->memBackends[local_30]->name,name);
    if (iVar1 == 0) break;
    local_30 = local_30 + 1;
  }
  *mem = handle->memBackends[local_30];
  return 0;
}

Assistant:

axbStatus_t axbMemBackendGetByName(struct axbHandle_s *handle, struct axbMemBackend_s **mem, const char *name)
{
  *mem = NULL;
  for (size_t i=0; i<handle->memBackends_size; ++i){
    if ( strcmp(handle->memBackends[i]->name, name) == 0) {
      *mem = handle->memBackends[i];
      return 0;
    }
  }
  return 0;
}